

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O2

int Mvc_CoverCountLiterals(Mvc_Cover_t *pCover)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  Mvc_Cube_t *pMVar6;
  
  uVar4 = 0;
  uVar2 = pCover->nBits;
  if (pCover->nBits < 1) {
    uVar2 = 0;
  }
  iVar1 = 0;
  while( true ) {
    uVar3 = (uint)uVar4;
    if (uVar3 == uVar2) break;
    iVar5 = 0;
    pMVar6 = (Mvc_Cube_t *)&pCover->lCubes;
    while (pMVar6 = pMVar6->pNext, pMVar6 != (Mvc_Cube_t *)0x0) {
      iVar5 = iVar5 + (uint)((pMVar6->pData[uVar4 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
    }
    iVar1 = iVar1 + iVar5;
    uVar4 = (ulong)(uVar3 + 1);
  }
  return iVar1;
}

Assistant:

int Mvc_CoverCountLiterals( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, CounterTot, CounterCur;

    // allocate/clean the storage for literals
//    Mvc_CoverAllocateArrayLits( pCover );
//    memset( pCover->pLits, 0, pCover->nBits * sizeof(int) );
    // go through each literal
    CounterTot = 0;
    for ( i = 0; i < pCover->nBits; i++ )
    {
        // get the word and bit of this literal
        nWord = Mvc_CubeWhichWord(i);
        nBit  = Mvc_CubeWhichBit(i);
        // go through all the cubes
        CounterCur = 0;
        Mvc_CoverForEachCube( pCover, pCube )
            if ( pCube->pData[nWord] & (1<<nBit) )
                CounterCur++;
        CounterTot += CounterCur;
    }
    return CounterTot;
}